

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ESOINN.cpp
# Opt level: O0

double __thiscall soinn::ESOINN::maxDensity(ESOINN *this,int classId)

{
  bool bVar1;
  reference ppvVar2;
  vertex_bundled *pvVar3;
  tuples local_50 [16];
  pair<std::_List_iterator<void_*>,_std::_List_iterator<void_*>_> local_40;
  _List_iterator<void_*> local_30;
  VertexIterator end;
  VertexIterator current;
  double density;
  int classId_local;
  ESOINN *this_local;
  
  current._M_node = (_List_node_base *)std::numeric_limits<double>::min();
  std::_List_iterator<void_*>::_List_iterator(&end);
  std::_List_iterator<void_*>::_List_iterator(&local_30);
  local_40 = boost::
             vertices<boost::detail::adj_list_gen<boost::adjacency_list<boost::listS,boost::listS,boost::undirectedS,boost::property<boost::vertex_index_t,unsigned_long,soinn::VertexProperties>,soinn::EdgeProperties,boost::no_property,boost::listS>,boost::listS,boost::listS,boost::undirectedS,boost::property<boost::vertex_index_t,unsigned_long,soinn::VertexProperties>,soinn::EdgeProperties,boost::no_property,boost::listS>::config,boost::undirected_graph_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::listS,boost::listS,boost::undirectedS,boost::property<boost::vertex_index_t,unsigned_long,soinn::VertexProperties>,soinn::EdgeProperties,boost::no_property,boost::listS>,boost::listS,boost::listS,boost::undirectedS,boost::property<boost::vertex_index_t,unsigned_long,soinn::VertexProperties>,soinn::EdgeProperties,boost::no_property,boost::listS>::config>>
                       ((adj_list_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::listS,_boost::listS,_boost::undirectedS,_boost::property<boost::vertex_index_t,_unsigned_long,_soinn::VertexProperties>,_soinn::EdgeProperties,_boost::no_property,_boost::listS>,_boost::listS,_boost::listS,_boost::undirectedS,_boost::property<boost::vertex_index_t,_unsigned_long,_soinn::VertexProperties>,_soinn::EdgeProperties,_boost::no_property,_boost::listS>::config,_boost::undirected_graph_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::listS,_boost::listS,_boost::undirectedS,_boost::property<boost::vertex_index_t,_unsigned_long,_soinn::VertexProperties>,_soinn::EdgeProperties,_boost::no_property,_boost::listS>,_boost::listS,_boost::listS,_boost::undirectedS,_boost::property<boost::vertex_index_t,_unsigned_long,_soinn::VertexProperties>,_soinn::EdgeProperties,_boost::no_property,_boost::listS>::config>_>
                         *)&this->graph);
  boost::tuples::tie<std::_List_iterator<void*>,std::_List_iterator<void*>>(local_50,&end,&local_30)
  ;
  boost::tuples::
  tuple<std::_List_iterator<void*>&,std::_List_iterator<void*>&,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type>
  ::operator=((tuple<std::_List_iterator<void*>&,std::_List_iterator<void*>&,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type>
               *)local_50,&local_40);
  while( true ) {
    bVar1 = std::operator!=(&end,&local_30);
    if (!bVar1) break;
    ppvVar2 = std::_List_iterator<void_*>::operator*(&end);
    pvVar3 = boost::
             adjacency_list<boost::listS,_boost::listS,_boost::undirectedS,_boost::property<boost::vertex_index_t,_unsigned_long,_soinn::VertexProperties>,_soinn::EdgeProperties,_boost::no_property,_boost::listS>
             ::operator[](&this->graph,*ppvVar2);
    if ((double)current._M_node < pvVar3->density) {
      ppvVar2 = std::_List_iterator<void_*>::operator*(&end);
      pvVar3 = boost::
               adjacency_list<boost::listS,_boost::listS,_boost::undirectedS,_boost::property<boost::vertex_index_t,_unsigned_long,_soinn::VertexProperties>,_soinn::EdgeProperties,_boost::no_property,_boost::listS>
               ::operator[](&this->graph,*ppvVar2);
      if (pvVar3->classId == classId) {
        ppvVar2 = std::_List_iterator<void_*>::operator*(&end);
        pvVar3 = boost::
                 adjacency_list<boost::listS,_boost::listS,_boost::undirectedS,_boost::property<boost::vertex_index_t,_unsigned_long,_soinn::VertexProperties>,_soinn::EdgeProperties,_boost::no_property,_boost::listS>
                 ::operator[](&this->graph,*ppvVar2);
        current._M_node = (_List_node_base *)pvVar3->density;
      }
    }
    std::_List_iterator<void_*>::operator++(&end,0);
  }
  return (double)current._M_node;
}

Assistant:

double ESOINN::maxDensity(int classId)
{
    double density = std::numeric_limits<double>::min();
    VertexIterator current, end;
    boost::tie(current, end) = boost::vertices(graph);
    for(; current != end; current++)
    {
        if(graph[*current].density > density && graph[*current].classId == classId)
        {
            density = graph[*current].density;
        }
    }
    return density;
}